

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<const_char16_t_(&)[12],_QString>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<const_char16_t_(&)[12],_QString> *this)

{
  long lVar1;
  char16_t *pcVar2;
  char16_t (*pacVar3) [12];
  undefined8 uVar4;
  char16_t *__src;
  
  lVar1 = (this->b).d.size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1 + 0xb,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  pacVar3 = this->a;
  *(undefined8 *)(pcVar2 + 7) = *(undefined8 *)(*pacVar3 + 7);
  uVar4 = *(undefined8 *)(*pacVar3 + 4);
  *(undefined8 *)pcVar2 = *(undefined8 *)*pacVar3;
  *(undefined8 *)(pcVar2 + 4) = uVar4;
  lVar1 = (this->b).d.size;
  if (lVar1 != 0) {
    __src = (this->b).d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar2 + 0xb,__src,lVar1 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }